

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O1

pack_t_conflict * pack_find(char *name)

{
  void *pvVar1;
  pack_t_conflict *ppVar2;
  
  pvVar1 = bsearch(name,formats,0x10,0x10,compare_format);
  if (pvVar1 == (void *)0x0) {
    ppVar2 = (pack_t_conflict *)0x0;
  }
  else {
    ppVar2 = *(pack_t_conflict **)((long)pvVar1 + 8);
  }
  return ppVar2;
}

Assistant:

pack_t *
pack_find(const char *name)
{
	struct format	*format;

	format = bsearch(name, formats,
	    sizeof(formats)/sizeof(formats[0]),
	    sizeof(formats[0]), compare_format);
	if (format == 0)
		return (NULL);
	return (format->pack);
}